

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int iso9660_write_header(archive_write *a,archive_entry *entry)

{
  mode_t mVar1;
  uint uVar2;
  int iVar3;
  int64_t iVar4;
  archive_write *a_00;
  isoent *file_00;
  uint *puVar5;
  uint64_t uVar6;
  archive_entry *in_RSI;
  archive *in_RDI;
  int ret;
  int r;
  isoent *isoent;
  isofile *file;
  iso9660_conflict *iso9660;
  isofile *in_stack_00000060;
  archive_write *in_stack_00000068;
  isoent **in_stack_00000140;
  archive_write *in_stack_00000148;
  isofile *in_stack_ffffffffffffffb8;
  archive_entry *in_stack_ffffffffffffffc0;
  int iVar7;
  undefined4 in_stack_ffffffffffffffcc;
  iso9660_conflict *iso9660_00;
  int local_4;
  
  iVar7 = 0;
  iso9660_00 = *(iso9660_conflict **)&in_RDI[1].current_codepage;
  iso9660_00->cur_file = (isofile *)0x0;
  iso9660_00->bytes_remaining = 0;
  iso9660_00->need_multi_extent = 0;
  mVar1 = archive_entry_filetype(in_RSI);
  if ((mVar1 == 0xa000) && (((uint)iso9660_00->opt >> 0x17 & 3) == 0)) {
    archive_set_error(in_RDI,-1,"Ignore symlink file.");
    iso9660_00->cur_file = (isofile *)0x0;
    local_4 = -0x14;
  }
  else {
    mVar1 = archive_entry_filetype(in_RSI);
    if ((mVar1 == 0x8000) && (iVar4 = archive_entry_size(in_RSI), 0xffffffff < iVar4)) {
      if (((uint)iso9660_00->opt >> 0xe & 7) < 3) {
        archive_set_error(in_RDI,-1,"Ignore over %lld bytes file. This file too large.",0x100000000)
        ;
        iso9660_00->cur_file = (isofile *)0x0;
        return -0x14;
      }
      iso9660_00->need_multi_extent = 1;
    }
    a_00 = (archive_write *)
           isofile_new((archive_write *)CONCAT44(in_stack_ffffffffffffffcc,iVar7),
                       in_stack_ffffffffffffffc0);
    if (a_00 == (archive_write *)0x0) {
      archive_set_error(in_RDI,0xc,"Can\'t allocate data");
      local_4 = -0x1e;
    }
    else {
      local_4 = isofile_gen_utility_names(in_stack_00000068,in_stack_00000060);
      if (local_4 < -0x14) {
        isofile_free((isofile *)in_stack_ffffffffffffffc0);
      }
      else {
        if (local_4 < iVar7) {
          iVar7 = local_4;
        }
        if ((*(size_t *)&(a_00->archive).file_count == 0) &&
           ((a_00->archive).error_string.length == 0)) {
          isofile_free((isofile *)in_stack_ffffffffffffffc0);
        }
        else {
          isofile_add_entry(iso9660_00,(isofile *)a_00);
          file_00 = isoent_new(in_stack_ffffffffffffffb8);
          if (file_00 == (isoent *)0x0) {
            archive_set_error(in_RDI,0xc,"Can\'t allocate data");
            local_4 = -0x1e;
          }
          else {
            if (iso9660_00->dircnt_max < file_00->file->dircnt) {
              iso9660_00->dircnt_max = file_00->file->dircnt;
            }
            local_4 = isoent_tree(in_stack_00000148,in_stack_00000140);
            if (local_4 == 0) {
              if ((archive_write *)file_00->file == a_00) {
                mVar1 = archive_entry_filetype(*(archive_entry **)&(a_00->archive).compression_code)
                ;
                local_4 = iVar7;
                if (mVar1 == 0x8000) {
                  iso9660_00->cur_file = (isofile *)a_00;
                  uVar2 = archive_entry_nlink(*(archive_entry **)&(a_00->archive).compression_code);
                  if ((uVar2 < 2) ||
                     (iVar3 = isofile_register_hardlink(a_00,(isofile *)file_00), iVar3 == 0)) {
                    if (iso9660_00->temp_fd < 0) {
                      iVar3 = __archive_mktemp((char *)iso9660_00);
                      iso9660_00->temp_fd = iVar3;
                      if (iso9660_00->temp_fd < 0) {
                        puVar5 = (uint *)__errno_location();
                        archive_set_error(in_RDI,(int)(ulong)*puVar5,
                                          "Couldn\'t create temporary file");
                        return -0x1e;
                      }
                    }
                    a_00->null_length =
                         (*(long *)(*(long *)&in_RDI[1].current_codepage + 0x102f0) + 0x10000) -
                         *(long *)(*(long *)&in_RDI[1].current_codepage + 0x102e0);
                    a_00->client_data = &a_00->null_length;
                    iVar3 = zisofs_init((archive_write *)in_RSI,(isofile *)iso9660_00);
                    if (iVar3 < iVar7) {
                      iVar7 = iVar3;
                    }
                    uVar6 = archive_entry_size(*(archive_entry **)&(a_00->archive).compression_code)
                    ;
                    iso9660_00->bytes_remaining = uVar6;
                    local_4 = iVar7;
                  }
                  else {
                    local_4 = -0x1e;
                  }
                }
              }
              else {
                local_4 = 0;
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int
iso9660_write_header(struct archive_write *a, struct archive_entry *entry)
{
	struct iso9660 *iso9660;
	struct isofile *file;
	struct isoent *isoent;
	int r, ret = ARCHIVE_OK;

	iso9660 = a->format_data;

	iso9660->cur_file = NULL;
	iso9660->bytes_remaining = 0;
	iso9660->need_multi_extent = 0;
	if (archive_entry_filetype(entry) == AE_IFLNK
	    && iso9660->opt.rr == OPT_RR_DISABLED) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Ignore symlink file.");
		iso9660->cur_file = NULL;
		return (ARCHIVE_WARN);
	}
	if (archive_entry_filetype(entry) == AE_IFREG &&
	    archive_entry_size(entry) >= MULTI_EXTENT_SIZE) {
		if (iso9660->opt.iso_level < 3) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Ignore over %lld bytes file. "
			    "This file too large.",
			    MULTI_EXTENT_SIZE);
				iso9660->cur_file = NULL;
			return (ARCHIVE_WARN);
		}
		iso9660->need_multi_extent = 1;
	}

	file = isofile_new(a, entry);
	if (file == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate data");
		return (ARCHIVE_FATAL);
	}
	r = isofile_gen_utility_names(a, file);
	if (r < ARCHIVE_WARN) {
		isofile_free(file);
		return (r);
	}
	else if (r < ret)
		ret = r;

	/*
	 * Ignore a path which looks like the top of directory name
	 * since we have already made the root directory of an ISO image.
	 */
	if (archive_strlen(&(file->parentdir)) == 0 &&
	    archive_strlen(&(file->basename)) == 0) {
		isofile_free(file);
		return (r);
	}

	isofile_add_entry(iso9660, file);
	isoent = isoent_new(file);
	if (isoent == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate data");
		return (ARCHIVE_FATAL);
	}
	if (isoent->file->dircnt > iso9660->dircnt_max)
		iso9660->dircnt_max = isoent->file->dircnt;

	/* Add the current file into tree */
	r = isoent_tree(a, &isoent);
	if (r != ARCHIVE_OK)
		return (r);

	/* If there is the same file in tree and
	 * the current file is older than the file in tree.
	 * So we don't need the current file data anymore. */
	if (isoent->file != file)
		return (ARCHIVE_OK);

	/* Non regular files contents are unneeded to be saved to
	 * temporary files. */
	if (archive_entry_filetype(file->entry) != AE_IFREG)
		return (ret);

	/*
	 * Set the current file to cur_file to read its contents.
	 */
	iso9660->cur_file = file;

	if (archive_entry_nlink(file->entry) > 1) {
		r = isofile_register_hardlink(a, file);
		if (r != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	/*
	 * Prepare to save the contents of the file.
	 */
	if (iso9660->temp_fd < 0) {
		iso9660->temp_fd = __archive_mktemp(NULL);
		if (iso9660->temp_fd < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't create temporary file");
			return (ARCHIVE_FATAL);
		}
	}

	/* Save an offset of current file in temporary file. */
	file->content.offset_of_temp = wb_offset(a);
	file->cur_content = &(file->content);
	r = zisofs_init(a, file);
	if (r < ret)
		ret = r;
	iso9660->bytes_remaining =  archive_entry_size(file->entry);

	return (ret);
}